

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmstradCPC.cpp
# Opt level: O2

void __thiscall
AmstradCPC::ConcreteMachine<true>::ConcreteMachine
          (ConcreteMachine<true> *this,Target *target,ROMFetcher *rom_fetcher)

{
  uint8_t *ram;
  KeyboardState *this_00;
  pointer puVar1;
  bool bVar2;
  bool bVar3;
  iterator iVar4;
  undefined4 *puVar5;
  Name name;
  Name name_00;
  Name basic;
  Name firmware;
  map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  roms;
  Request local_80;
  Request request;
  
  (this->super_ScanProducer)._vptr_ScanProducer = (_func_int **)&PTR___cxa_pure_virtual_0057d600;
  (this->super_AudioProducer)._vptr_AudioProducer = (_func_int **)&PTR___cxa_pure_virtual_0057cd58;
  (this->super_TimedMachine)._vptr_TimedMachine = (_func_int **)&PTR_run_for_0057d638;
  (this->super_TimedMachine).clock_rate_ = 1.0;
  (this->super_TimedMachine).clock_conversion_error_ = 0.0;
  (this->super_TimedMachine).speed_multiplier_ = 1.0;
  (this->super_MediaTarget)._vptr_MediaTarget = (_func_int **)&PTR___cxa_pure_virtual_0057d680;
  roms._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &roms._M_t._M_impl.super__Rb_tree_header._M_header;
  roms._M_t._M_impl._0_8_ = 0;
  roms._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  roms._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  roms._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  roms._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  roms._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       roms._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  MachineTypes::MappedKeyboardMachine::MappedKeyboardMachine
            (&this->super_MappedKeyboardMachine,
             (set<Inputs::Keyboard::Key,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
              *)&roms);
  std::
  _Rb_tree<Inputs::Keyboard::Key,_Inputs::Keyboard::Key,_std::_Identity<Inputs::Keyboard::Key>,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
  ::~_Rb_tree((_Rb_tree<Inputs::Keyboard::Key,_Inputs::Keyboard::Key,_std::_Identity<Inputs::Keyboard::Key>,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
               *)&roms);
  (this->super_TypeRecipient<AmstradCPC::CharacterMapper>).typer_._M_t.
  super___uniq_ptr_impl<Utility::Typer,_std::default_delete<Utility::Typer>_>._M_t.
  super__Tuple_impl<0UL,_Utility::Typer_*,_std::default_delete<Utility::Typer>_>.
  super__Head_base<0UL,_Utility::Typer_*,_false>._M_head_impl = (Typer *)0x0;
  (this->super_TypeRecipient<AmstradCPC::CharacterMapper>).previous_typer_._M_t.
  super___uniq_ptr_impl<Utility::Typer,_std::default_delete<Utility::Typer>_>._M_t.
  super__Tuple_impl<0UL,_Utility::Typer_*,_std::default_delete<Utility::Typer>_>.
  super__Head_base<0UL,_Utility::Typer_*,_false>._M_head_impl = (Typer *)0x0;
  (this->super_TypeRecipient<AmstradCPC::CharacterMapper>).character_mapper.super_CharacterMapper.
  _vptr_CharacterMapper = (_func_int **)&PTR__CharacterMapper_0057def8;
  (this->super_ScanProducer)._vptr_ScanProducer = (_func_int **)&PTR_set_scan_target_0057d250;
  (this->super_AudioProducer)._vptr_AudioProducer = (_func_int **)&DAT_0057d318;
  (this->super_TimedMachine)._vptr_TimedMachine = (_func_int **)&PTR_run_for_0057d330;
  (this->super_MediaTarget)._vptr_MediaTarget = (_func_int **)&DAT_0057d378;
  (this->super_MappedKeyboardMachine).super_Delegate._vptr_Delegate =
       (_func_int **)&PTR_keyboard_did_change_key_0057d390;
  (this->super_MappedKeyboardMachine).super_KeyboardMachine.super_KeyActions._vptr_KeyActions =
       (_func_int **)&PTR_set_key_state_0057d3c0;
  (this->super_JoystickMachine)._vptr_JoystickMachine = (_func_int **)&DAT_0057d400;
  (this->super_TypeRecipient<AmstradCPC::CharacterMapper>).super_Delegate.super_KeyActions.
  _vptr_KeyActions = (_func_int **)&PTR_set_key_state_0057d418;
  (this->super_Observer)._vptr_Observer = (_func_int **)&DAT_0057d458;
  (this->super_Device)._vptr_Device = (_func_int **)&PTR_set_options_0057d470;
  (this->super_Machine)._vptr_Machine = (_func_int **)&PTR__ConcreteMachine_0057d490;
  (this->super_Source)._vptr_Source = (_func_int **)&DAT_0057d4b0;
  CPU::Z80::Processor<AmstradCPC::ConcreteMachine<true>,_false,_true>::Processor(&this->z80_,this);
  ram = this->ram_;
  CRTCBusHandler::CRTCBusHandler(&this->crtc_bus_handler_,ram,&this->interrupt_timer_);
  Motorola::CRTC::
  CRTC6845<AmstradCPC::CRTCBusHandler,_(Motorola::CRTC::Personality)0,_(Motorola::CRTC::CursorType)0>
  ::CRTC6845(&this->crtc_,&this->crtc_bus_handler_);
  AYDeferrer::AYDeferrer(&this->ay_);
  this_00 = &this->key_state_;
  (this->i8255_port_handler_).ay_ = &this->ay_;
  (this->i8255_port_handler_).crtc_ = &this->crtc_;
  (this->i8255_port_handler_).key_state_ = this_00;
  (this->i8255_port_handler_).tape_player_ = &this->tape_player_;
  (this->i8255_).control_ = '\0';
  (this->i8255_).outputs_[0] = '\0';
  (this->i8255_).outputs_[1] = '\0';
  (this->i8255_).outputs_[2] = '\0';
  (this->i8255_).port_handler_ = &this->i8255_port_handler_;
  Amstrad::FDC::FDC(&this->fdc_,(Cycles)0x7a1200);
  (this->interrupt_timer_).timer_ = 0;
  (this->time_since_fdc_update_).super_WrappedInt<HalfCycles>.length_ = 0;
  *(undefined8 *)((long)&(this->time_since_fdc_update_).super_WrappedInt<HalfCycles>.length_ + 6) =
       0;
  Storage::Tape::BinaryTapePlayer::BinaryTapePlayer(&this->tape_player_,8000000);
  CRC::CCITT::CCITT(&this->tape_crc_);
  this->use_fast_tape_hack_ = false;
  this->allow_fast_tape_hack_ = false;
  (this->clock_offset_).super_WrappedInt<HalfCycles>.length_ = 0;
  (this->crtc_counter_).super_WrappedInt<HalfCycles>.length_ = 4;
  (this->half_cycles_since_ay_update_).super_WrappedInt<HalfCycles>.length_ = 0;
  *(undefined4 *)
   ((long)&(this->half_cycles_since_ay_update_).super_WrappedInt<HalfCycles>.length_ + 7) = 0;
  this->roms_[0].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  this->roms_[0].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->roms_[0].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->roms_[1].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  this->roms_[1].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->roms_[1].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->roms_[2].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  this->roms_[2].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&this->roms_[2].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&this->roms_[2].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 1) = 0;
  this->ram_pages_[0] = (uint8_t *)0x0;
  this->ram_pages_[1] = (uint8_t *)0x0;
  this->ram_pages_[2] = (uint8_t *)0x0;
  this->ram_pages_[3] = (uint8_t *)0x0;
  this->read_pointers_[0] = (uint8_t *)0x0;
  this->read_pointers_[1] = (uint8_t *)0x0;
  this->read_pointers_[2] = (uint8_t *)0x0;
  this->read_pointers_[3] = (uint8_t *)0x0;
  this->write_pointers_[0] = (uint8_t *)0x0;
  this->write_pointers_[1] = (uint8_t *)0x0;
  this->write_pointers_[2] = (uint8_t *)0x0;
  this->write_pointers_[3] = (uint8_t *)0x0;
  KeyboardState::KeyboardState(this_00);
  (this->keyboard_mapper_).super_KeyboardMapper._vptr_KeyboardMapper =
       (_func_int **)&PTR_mapped_key_for_key_0057dec8;
  this->has_run_ = false;
  (this->super_TimedMachine).clock_rate_ = 4000000.0;
  Memory::Fuzz(ram,0x20000);
  (this->fdc_).super_i8272.super_MFMController.super_Controller.super_Source.observer_ =
       &this->super_Observer;
  ClockingHint::Source::update_clocking_observer((Source *)&this->fdc_);
  (this->tape_player_).super_TapePlayer.super_Source.observer_ = &this->super_Observer;
  ClockingHint::Source::update_clocking_observer
            (&(this->tape_player_).super_TapePlayer.super_Source);
  GI::AY38910::AY38910SampleSource<true>::set_port_handler
            (&(this->ay_).ay_.super_AY38910SampleSource<true>,&this_00->super_PortHandler);
  if (target->model == CPC464) {
    firmware = CPC464Firmware;
    basic = CPC464BASIC;
    name_00 = CPC464Firmware;
    name = CPC464BASIC;
    bVar2 = false;
  }
  else {
    if (target->model == CPC664) {
      firmware = CPC664Firmware;
      basic = CPC664BASIC;
      name_00 = CPC664Firmware;
      name = CPC664BASIC;
    }
    else {
      firmware = CPC6128Firmware;
      basic = CPC6128BASIC;
      name_00 = CPC6128Firmware;
      name = CPC6128BASIC;
    }
    bVar2 = true;
  }
  ROM::Request::Request((Request *)&roms,name_00,false);
  ROM::Request::Request(&local_80,name,false);
  ROM::Request::operator&&(&request,(Request *)&roms,&local_80);
  std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
            (&local_80.node.children);
  std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
            ((vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_> *)
             &roms._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  if (bVar2) {
    ROM::Request::Request(&local_80,AMSDOS,false);
    ROM::Request::operator&&((Request *)&roms,&request,&local_80);
    ROM::Request::Node::operator=(&request.node,(Node *)&roms);
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
              ((vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_> *)
               &roms._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
              (&local_80.node.children);
  }
  std::
  function<std::map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_(const_ROM::Request_&)>
  ::operator()(&roms,rom_fetcher,&request);
  bVar3 = ROM::Request::validate(&request,&roms);
  if (bVar3) {
    if (bVar2) {
      local_80.node.type = 0x12;
      iVar4 = std::
              _Rb_tree<ROM::Name,_std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
              ::find(&roms._M_t,(key_type *)&local_80);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                (this->roms_,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 &iVar4._M_node[1]._M_parent);
    }
    iVar4 = std::
            _Rb_tree<ROM::Name,_std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
            ::find(&roms._M_t,&firmware);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (this->roms_ + 1,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&iVar4._M_node[1]._M_parent)
    ;
    iVar4 = std::
            _Rb_tree<ROM::Name,_std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
            ::find(&roms._M_t,&basic);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (this->roms_ + 2,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&iVar4._M_node[1]._M_parent)
    ;
    this->upper_rom_is_paged_ = true;
    this->upper_rom_ = BASIC;
    this->write_pointers_[0] = ram;
    this->write_pointers_[1] = this->ram_ + 0x4000;
    this->write_pointers_[2] = this->ram_ + 0x8000;
    this->write_pointers_[3] = this->ram_ + 0xc000;
    puVar1 = this->roms_[2].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    this->read_pointers_[0] =
         this->roms_[1].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
    this->read_pointers_[1] = this->ram_ + 0x4000;
    this->read_pointers_[2] = this->ram_ + 0x8000;
    this->read_pointers_[3] = puVar1;
    this->has_128k_ = target->model == CPC6128;
    if ((target->loading_command)._M_string_length != 0) {
      Utility::TypeRecipient<AmstradCPC::CharacterMapper>::add_typer
                (&this->super_TypeRecipient<AmstradCPC::CharacterMapper>,&target->loading_command);
    }
    insert_media(this,&(target->super_Target).media);
    std::
    _Rb_tree<ROM::Name,_std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
    ::~_Rb_tree(&roms._M_t);
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
              (&request.node.children);
    return;
  }
  puVar5 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar5 = 0;
  __cxa_throw(puVar5,&ROMMachine::Error::typeinfo,0);
}

Assistant:

ConcreteMachine(const Analyser::Static::AmstradCPC::Target &target, const ROMMachine::ROMFetcher &rom_fetcher) :
			z80_(*this),
			crtc_bus_handler_(ram_, interrupt_timer_),
			crtc_(crtc_bus_handler_),
			i8255_port_handler_(key_state_, crtc_, ay_, tape_player_),
			i8255_(i8255_port_handler_),
			tape_player_(8000000),
			crtc_counter_(HalfCycles(4))	// This starts the CRTC exactly out of phase with the CPU's memory accesses
		{
			// primary clock is 4Mhz
			set_clock_rate(4000000);

			// ensure memory starts in a random state
			Memory::Fuzz(ram_, sizeof(ram_));

			// register this class as the sleep observer for the FDC and tape
			fdc_.set_clocking_hint_observer(this);
			tape_player_.set_clocking_hint_observer(this);

			// install the keyboard state class as the AY port handler
			ay_.ay().set_port_handler(&key_state_);

			// construct the list of necessary ROMs
			bool has_amsdos = false;
			ROM::Name firmware, basic;

			using Model = Analyser::Static::AmstradCPC::Target::Model;
			switch(target.model) {
				case Model::CPC464:
					firmware = ROM::Name::CPC464Firmware;
					basic = ROM::Name::CPC464BASIC;
				break;
				case Model::CPC664:
					firmware = ROM::Name::CPC664Firmware;
					basic = ROM::Name::CPC664BASIC;
					has_amsdos = true;
				break;
				default:
					firmware = ROM::Name::CPC6128Firmware;
					basic = ROM::Name::CPC6128BASIC;
					has_amsdos = true;
				break;
			}

			ROM::Request request = ROM::Request(firmware) && ROM::Request(basic);
			if(has_amsdos) {
				request = request && ROM::Request(ROM::Name::AMSDOS);
			}

			// Fetch and verify the ROMs.
			auto roms = rom_fetcher(request);
			if(!request.validate(roms)) {
				throw ROMMachine::Error::MissingROMs;
			}

			if(has_amsdos) {
				roms_[ROMType::AMSDOS] = roms.find(ROM::Name::AMSDOS)->second;
			}
			roms_[ROMType::OS] = roms.find(firmware)->second;
			roms_[ROMType::BASIC] = roms.find(basic)->second;

			// Establish default memory map
			upper_rom_is_paged_ = true;
			upper_rom_ = ROMType::BASIC;

			write_pointers_[0] = &ram_[0x0000];
			write_pointers_[1] = &ram_[0x4000];
			write_pointers_[2] = &ram_[0x8000];
			write_pointers_[3] = &ram_[0xc000];

			read_pointers_[0] = roms_[ROMType::OS].data();
			read_pointers_[1] = write_pointers_[1];
			read_pointers_[2] = write_pointers_[2];
			read_pointers_[3] = roms_[upper_rom_].data();

			// Set total RAM available.
			has_128k_ = target.model == Model::CPC6128;

			// Type whatever is required.
			if(!target.loading_command.empty()) {
				type_string(target.loading_command);
			}

			insert_media(target.media);
		}